

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

string * __thiscall
ot::commissioner::Interpreter::BaThreadIfStatusToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,uint32_t aIfStatus)

{
  allocator *paVar1;
  int iVar2;
  char *pcVar3;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  iVar2 = (int)this;
  if (iVar2 == 2) {
    pcVar3 = "active";
    paVar1 = &local_b;
  }
  else if (iVar2 == 1) {
    pcVar3 = "inactive";
    paVar1 = &local_a;
  }
  else if (iVar2 == 0) {
    pcVar3 = "uninitialized";
    paVar1 = &local_9;
  }
  else {
    pcVar3 = "reserved";
    paVar1 = &local_c;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::BaThreadIfStatusToString(uint32_t aIfStatus)
{
    switch (aIfStatus)
    {
    case 0:
        return "uninitialized";
    case 1:
        return "inactive";
    case 2:
        return "active";
    default:
        return "reserved";
    }
}